

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O3

int crazyRead(void *context,char *buffer,int len)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  clock_t cVar4;
  size_t sVar5;
  int iVar6;
  int local_2c;
  
  if (len < 0 || (buffer == (char *)0x0 || context == (void *)0x0)) {
    return -1;
  }
  cVar4 = clock();
  iVar3 = rlen;
  if ((cVar4 - t0 < 3000000) || (timeout = 1, instate != 1)) {
    if (instate == 0) {
      iVar6 = rlen - len;
      if (iVar6 == 0 || rlen < len) {
        sVar5 = (size_t)rlen;
        rlen = 0;
        memcpy(buffer,current,sVar5);
        curlen = 0;
        instate = 1;
        return iVar3;
      }
      goto LAB_0010302c;
    }
    if (instate == 1) {
      uVar1 = 0x1000;
      if ((uint)len < 0x1000) {
        uVar1 = len;
      }
      memcpy(buffer,filling,(ulong)uVar1);
      pcVar2 = crazy;
      curlen = curlen + uVar1;
      if (maxlen <= curlen) {
        sVar5 = strlen(crazy);
        rlen = (int)sVar5 - crazy_indx;
        current = pcVar2 + crazy_indx;
        instate = 2;
        return uVar1;
      }
      return uVar1;
    }
    local_2c = rlen;
    if (instate != 2) {
      return 0;
    }
  }
  else {
    crazyRead_cold_1();
  }
  iVar6 = local_2c - len;
  if (iVar6 == 0 || local_2c < len) {
    rlen = 0;
    memcpy(buffer,current,(long)local_2c);
    instate = 3;
    curlen = 0;
    return local_2c;
  }
LAB_0010302c:
  pcVar2 = current;
  memcpy(buffer,current,(ulong)(uint)len);
  rlen = iVar6;
  current = pcVar2 + (uint)len;
  return len;
}

Assistant:

static int
crazyRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if ((check_time() <= 0) && (instate == 1)) {
        fprintf(stderr, "\ntimeout in crazy(%d)\n", crazy_indx);
        rlen = strlen(crazy) - crazy_indx;
        current = &crazy[crazy_indx];
        instate = 2;
    }
    if (instate == 0) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 1;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 2) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 3;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 1) {
        if (len > CHUNK) len = CHUNK;
        memcpy(buffer, &filling[0], len);
        curlen += len;
        if (curlen >= maxlen) {
            rlen = strlen(crazy) - crazy_indx;
            current = &crazy[crazy_indx];
            instate = 2;
        }
    } else
      len = 0;
    return (len);
}